

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::UpdateMergeFetch<duckdb::uhugeint_t>
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,
               Vector *result)

{
  undefined8 *puVar1;
  uint uVar2;
  data_ptr_t __dest;
  data_ptr_t pdVar3;
  undefined8 uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  UndoBufferPointer update_ptr;
  UndoBufferPointer local_68;
  UndoBufferReference local_58;
  
  __dest = result->data;
  if (((start_time < (info->version_number).super___atomic_base<unsigned_long>._M_i) &&
      ((info->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) &&
     (info->N != 0)) {
    uVar6 = (ulong)info->max;
    if (info->N == 0x800) {
      switchD_012b9b0d::default(__dest,(void *)((long)&info[1].segment + uVar6 * 4),0x8000);
    }
    else {
      uVar7 = 0;
      do {
        uVar2 = *(uint *)((long)&info[1].segment + uVar7 * 4);
        puVar1 = (undefined8 *)((long)&info[1].segment + uVar6 * 4);
        uVar4 = puVar1[1];
        *(undefined8 *)(__dest + (ulong)uVar2 * 0x10) = *puVar1;
        *(undefined8 *)(__dest + (ulong)uVar2 * 0x10 + 8) = uVar4;
        uVar7 = uVar7 + 1;
        uVar6 = uVar6 + 4;
      } while (uVar7 < info->N);
    }
  }
  local_68.entry = (info->next).entry;
  local_68.position = (info->next).position;
  if (local_68.entry != (UndoBufferEntry *)0x0) {
    do {
      UndoBufferPointer::Pin(&local_58,&local_68);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.handle.node);
      iVar5 = local_58.position;
      pdVar3 = (local_58.handle.node.ptr)->buffer;
      if (((start_time < *(ulong *)(pdVar3 + local_58.position + 0x10)) &&
          (*(transaction_t *)(pdVar3 + local_58.position + 0x10) != transaction_id)) &&
         (*(int *)(pdVar3 + local_58.position + 0x20) != 0)) {
        uVar6 = (ulong)*(uint *)(pdVar3 + local_58.position + 0x24);
        if (*(int *)(pdVar3 + local_58.position + 0x20) == 0x800) {
          switchD_012b9b0d::default(__dest,pdVar3 + uVar6 * 4 + local_58.position + 0x48,0x8000);
        }
        else {
          uVar7 = 0;
          do {
            uVar2 = *(uint *)(pdVar3 + uVar7 * 4 + local_58.position + 0x48);
            uVar4 = *(undefined8 *)(pdVar3 + uVar6 * 4 + local_58.position + 0x48 + 8);
            *(undefined8 *)(__dest + (ulong)uVar2 * 0x10) =
                 *(undefined8 *)(pdVar3 + uVar6 * 4 + local_58.position + 0x48);
            *(undefined8 *)(__dest + (ulong)uVar2 * 0x10 + 8) = uVar4;
            uVar7 = uVar7 + 1;
            uVar6 = uVar6 + 4;
          } while (uVar7 < *(uint *)(pdVar3 + local_58.position + 0x20));
        }
      }
      local_68.entry = *(UndoBufferEntry **)(pdVar3 + iVar5 + 0x38);
      local_68.position = *(idx_t *)(pdVar3 + iVar5 + 0x40);
      BufferHandle::~BufferHandle(&local_58.handle);
    } while (local_68.entry != (UndoBufferEntry *)0x0);
  }
  return;
}

Assistant:

static void UpdateMergeFetch(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id,
	                                  [&](UpdateInfo &current) { MergeUpdateInfo<T>(current, result_data); });
}